

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

bool __thiscall Clasp::Solver::backtrack(Solver *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Literal lastChoiceInverted;
  Literal local_34;
  ImpliedLiteral local_30;
  
  local_34.rep_ = 0;
  uVar3 = (this->levels_).super_type.ebo_.size;
  if (uVar3 != (this->levels_).root) {
    do {
      local_34.rep_ =
           *(uint *)((long)&((this->assign_).trail.ebo_.buf)->rep_ +
                    (ulong)(uint)(*(int *)((this->levels_).super_type.ebo_.buf + (uVar3 - 1)) << 2))
           & 0xfffffffe ^ 2;
      undoUntil(this,uVar3 - 1,2);
      if (-1 < *(int *)&(this->levels_).field_0x14) {
        uVar3 = (this->levels_).super_type.ebo_.size;
        uVar2 = (this->levels_).root;
        if (uVar2 < uVar3) {
          uVar2 = uVar3;
        }
        *(uint *)&(this->levels_).field_0x14 = uVar2 & 0x3fffffff | 0x40000000;
      }
      if ((this->conflict_).ebo_.size == 0) {
        local_30.lit.rep_ = 0;
        local_30.level = 0;
        bVar1 = force(this,&local_34,(Antecedent *)&local_30);
        uVar3 = (this->levels_).super_type.ebo_.size;
        if (bVar1) {
          local_30.level = uVar3;
          local_30.lit.rep_ = local_34.rep_;
          local_30.ante.super_pair<Clasp::Antecedent,_unsigned_int>.first.data_ = 0;
          local_30.ante.super_pair<Clasp::Antecedent,_unsigned_int>.second = 0xffffffff;
          if ((this->impliedLits_).level < uVar3) {
            (this->impliedLits_).level = uVar3;
          }
          bk_lib::pod_vector<Clasp::ImpliedLiteral,_std::allocator<Clasp::ImpliedLiteral>_>::
          push_back(&(this->impliedLits_).lits,&local_30);
          return true;
        }
      }
      else {
        uVar3 = (this->levels_).super_type.ebo_.size;
      }
    } while (uVar3 != (this->levels_).root);
  }
  setStopConflict(this);
  return false;
}

Assistant:

bool Solver::backtrack() {
	Literal lastChoiceInverted;
	do {
		if (decisionLevel() == rootLevel()) {
			setStopConflict();
			return false;
		}
		lastChoiceInverted = ~decision(decisionLevel());
		undoUntil(decisionLevel() - 1, undo_pop_proj_level);
		setBacktrackLevel(decisionLevel(), undo_pop_bt_level);
	} while (hasConflict() || !force(lastChoiceInverted, 0));
	// remember flipped literal for copyGuidingPath()
	impliedLits_.add(decisionLevel(), ImpliedLiteral(lastChoiceInverted, decisionLevel(), 0));
	return true;
}